

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O0

void __thiscall
qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::apply
          (QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *this,Side side,
          Op op,int nbQubits,SquareMatrix<std::complex<double>_> *matrix,int offset)

{
  bool bVar1;
  reference puVar2;
  pointer pQVar3;
  reference puVar4;
  undefined1 local_68 [8];
  undefined1 local_60 [8];
  const_reverse_iterator it_3;
  __normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>_>
  local_50;
  const_iterator it_2;
  __normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>_>
  local_40;
  const_iterator it_1;
  undefined1 local_30 [8];
  const_reverse_iterator it;
  int offset_local;
  SquareMatrix<std::complex<double>_> *matrix_local;
  int nbQubits_local;
  Op op_local;
  Side side_local;
  QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *this_local;
  
  it.current._M_current._4_4_ = offset;
  if (op == NoTrans) {
    if (side == Left) {
      rbegin((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)local_30);
      while( true ) {
        rend((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)&it_1);
        bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>_>_>
                                 *)local_30,
                                (reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>_>_>
                                 *)&it_1);
        if (!bVar1) break;
        puVar2 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>_>_>
                              *)local_30);
        pQVar3 = std::
                 unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
                 ::operator->(puVar2);
        (*pQVar3->_vptr_QObject[9])
                  (pQVar3,0x4c,0x4e,(ulong)(uint)nbQubits,matrix,
                   (ulong)(uint)(this->offset_ + it.current._M_current._4_4_));
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>_>_>
        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>_>_>
                      *)local_30);
      }
    }
    else {
      local_40._M_current =
           (unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
            *)begin(this);
      while( true ) {
        it_2 = end(this);
        bVar1 = __gnu_cxx::operator!=(&local_40,&it_2);
        if (!bVar1) break;
        puVar4 = __gnu_cxx::
                 __normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>_>
                 ::operator*(&local_40);
        pQVar3 = std::
                 unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
                 ::operator->(puVar4);
        (*pQVar3->_vptr_QObject[9])
                  (pQVar3,(ulong)(uint)(int)(char)side,0x4e,(ulong)(uint)nbQubits,matrix,
                   (ulong)(uint)(this->offset_ + it.current._M_current._4_4_));
        __gnu_cxx::
        __normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>_>
        ::operator++(&local_40);
      }
    }
  }
  else if (side == Left) {
    local_50._M_current =
         (unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
          *)begin(this);
    while( true ) {
      it_3.current._M_current = end(this);
      bVar1 = __gnu_cxx::operator!=(&local_50,&it_3.current);
      if (!bVar1) break;
      puVar4 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>_>
               ::operator*(&local_50);
      pQVar3 = std::
               unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
               ::operator->(puVar4);
      (*pQVar3->_vptr_QObject[9])
                (pQVar3,0x4c,(ulong)(uint)(int)(char)op,(ulong)(uint)nbQubits,matrix,
                 (ulong)(uint)(this->offset_ + it.current._M_current._4_4_));
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>_>
      ::operator++(&local_50);
    }
  }
  else {
    rbegin((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)local_60);
    while( true ) {
      rend((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)local_68);
      bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>_>_>
                               *)local_60,
                              (reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>_>_>
                               *)local_68);
      if (!bVar1) break;
      puVar2 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>_>_>
                            *)local_60);
      pQVar3 = std::
               unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>
               ::operator->(puVar2);
      (*pQVar3->_vptr_QObject[9])
                (pQVar3,(ulong)(uint)(int)(char)side,(ulong)(uint)(int)(char)op,
                 (ulong)(uint)nbQubits,matrix,
                 (ulong)(uint)(this->offset_ + it.current._M_current._4_4_));
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_*,_std::vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>_>_>
                    *)local_60);
    }
  }
  return;
}

Assistant:

void apply( Side side , Op op , const int nbQubits ,
                  qclab::dense::SquareMatrix< T >& matrix ,
                  const int offset = 0 ) const override {
        if ( op == Op::NoTrans ) {
          if ( side == Side::Left ) {
            // Left + NoTrans
            for ( auto it = rbegin(); it != rend(); ++it ) {
              (*it)->apply( side , op , nbQubits , matrix , offset_ + offset ) ;
            }
          } else {
            // Right + NoTrans
            for ( auto it = begin(); it != end(); ++it ) {
              (*it)->apply( side , op , nbQubits , matrix , offset_ + offset ) ;
            }
          }
        } else {
          if ( side == Side::Left ) {
            // Left + [Conj]Trans
            for ( auto it = begin(); it != end(); ++it ) {
              (*it)->apply( side , op , nbQubits , matrix , offset_ + offset ) ;
            }
          } else {
            // Right + [Conj]Trans
            for ( auto it = rbegin(); it != rend(); ++it ) {
              (*it)->apply( side , op , nbQubits , matrix , offset_ + offset ) ;
            }
          }
        }
      }